

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::InplaceVectorTest_ComplexType_Test::TestBody
          (InplaceVectorTest_ComplexType_Test *this)

{
  pointer *ppiVar1;
  allocator<int> *paVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  bool bVar3;
  char *pcVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  char *in_R9;
  pointer *local_d78;
  string local_b40;
  AssertHelper local_b20;
  Message local_b18;
  vector<int,_std::allocator<int>_> local_b10;
  bool local_af1;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar__13;
  Message local_ad8;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_21;
  AssertHelper local_aa0;
  Message local_a98;
  vector<int,_std::allocator<int>_> local_a90;
  vector<int,_std::allocator<int>_> *local_a78;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_a48 [8];
  vector<int,_std::allocator<int>_> v;
  AssertHelper local_a10;
  Message local_a08;
  bool local_9f9;
  undefined1 local_9f8 [8];
  AssertionResult gtest_ar__11;
  vector<int,_std::allocator<int>_> *vec_1;
  vector<int,_std::allocator<int>_> *__end2_1;
  vector<int,_std::allocator<int>_> *__begin2_1;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *__range2_1;
  Message local_9c0;
  size_t local_9b8;
  uint local_9ac;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_978;
  Message local_970;
  bool local_961;
  undefined1 local_960 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_930;
  Message local_928;
  bool local_919;
  undefined1 local_918 [8];
  AssertionResult gtest_ar__9;
  Message local_900;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_19;
  Message local_8e0;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_18;
  Message local_8c0;
  size_t local_8b8;
  uint local_8ac;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_17;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> vec_of_vecs5;
  AssertHelper local_810;
  Message local_808;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__8;
  vector<int,_std::allocator<int>_> *vec;
  vector<int,_std::allocator<int>_> *__end2;
  vector<int,_std::allocator<int>_> *__begin2;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *__range2;
  Message local_7c0;
  size_t local_7b8;
  uint local_7ac;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_778;
  Message local_770;
  bool local_761;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__6;
  Message local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_15;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_14;
  Message local_6c0;
  size_t local_6b8;
  uint local_6ac;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_13;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> vec_of_vecs4;
  AssertHelper local_610;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__4;
  Message local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_12;
  Message local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_11;
  Message local_558;
  size_t local_550;
  uint local_544;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_10;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> vec_of_vecs3;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__2;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_9;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_8;
  Message local_3f0;
  size_t local_3e8;
  uint local_3dc;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_7;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> vec_of_vecs2;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_6;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_5;
  Message local_288;
  size_t local_280;
  uint local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  size_t local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_3;
  Message local_228;
  size_t local_220;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> local_1e8;
  AssertHelper local_1d0;
  Message local_1c8;
  Span<const_std::vector<int,_std::allocator<int>_>_> local_1c0;
  Span<std::vector<int,_std::allocator<int>_>_> local_1b0;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  Span<const_std::vector<int,_std::allocator<int>_>_> local_180;
  Span<std::vector<int,_std::allocator<int>_>_> local_170;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  allocator<int> local_13d;
  int local_13c [3];
  iterator local_130;
  size_type local_128;
  allocator<int> local_11d;
  int local_11c [3];
  iterator local_110;
  size_type local_108;
  allocator<int> local_ed;
  int local_ec [3];
  iterator local_e0;
  size_type local_d8;
  pointer *local_d0;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> data [3];
  undefined1 local_78 [8];
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> vec_of_vecs;
  InplaceVectorTest_ComplexType_Test *this_local;
  
  vec_of_vecs._96_8_ = this;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  local_ec[0] = 1;
  local_ec[1] = 2;
  local_ec[2] = 3;
  local_e0 = local_ec;
  local_d8 = 3;
  local_d0 = (pointer *)local_c8;
  std::allocator<int>::allocator(&local_ed);
  __l_03._M_len = local_d8;
  __l_03._M_array = local_e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,__l_03,&local_ed);
  ppiVar1 = &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_11c[0] = 4;
  local_11c[1] = 5;
  local_11c[2] = 6;
  local_110 = local_11c;
  local_108 = 3;
  local_d0 = ppiVar1;
  std::allocator<int>::allocator(&local_11d);
  __l_02._M_len = local_108;
  __l_02._M_array = local_110;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)ppiVar1,__l_02,&local_11d);
  ppiVar1 = &data[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_13c[0] = 7;
  local_13c[1] = 8;
  local_13c[2] = 9;
  local_130 = local_13c;
  local_128 = 3;
  local_d0 = ppiVar1;
  std::allocator<int>::allocator(&local_13d);
  __l_01._M_len = local_128;
  __l_01._M_array = local_130;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)ppiVar1,__l_01,&local_13d);
  std::allocator<int>::~allocator(&local_13d);
  std::allocator<int>::~allocator(&local_11d);
  std::allocator<int>::~allocator(&local_ed);
  Span<std::vector<int,std::allocator<int>>const>::Span<3ul>
            ((Span<std::vector<int,std::allocator<int>>const> *)&gtest_ar.message_,
             (vector<int,_std::allocator<int>_> (*) [3])local_c8);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::CopyFrom
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,
             stack0xfffffffffffffeb0);
  Span<std::vector<int,std::allocator<int>>>::
  Span<bssl::InplaceVector<std::vector<int,std::allocator<int>>,4ul>,void,bssl::InplaceVector<std::vector<int,std::allocator<int>>,4ul>>
            ((Span<std::vector<int,std::allocator<int>>> *)&local_170,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  Span<std::vector<int,std::allocator<int>>const>::Span<3ul>
            ((Span<std::vector<int,std::allocator<int>>const> *)&local_180,
             (vector<int,_std::allocator<int>_> (*) [3])local_c8);
  testing::internal::EqHelper::
  Compare<bssl::Span<std::vector<int,_std::allocator<int>_>_>,_bssl::Span<const_std::vector<int,_std::allocator<int>_>_>,_nullptr>
            ((EqHelper *)local_160,"Span(vec_of_vecs)","Span(data)",&local_170,&local_180);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar3) {
    testing::Message::Message(&local_188);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::Resize
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,2);
  Span<std::vector<int,std::allocator<int>>>::
  Span<bssl::InplaceVector<std::vector<int,std::allocator<int>>,4ul>,void,bssl::InplaceVector<std::vector<int,std::allocator<int>>,4ul>>
            ((Span<std::vector<int,std::allocator<int>>> *)&local_1b0,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  Span<const_std::vector<int,_std::allocator<int>_>_>::Span
            (&local_1c0,(vector<int,_std::allocator<int>_> *)local_c8,2);
  testing::internal::EqHelper::
  Compare<bssl::Span<std::vector<int,_std::allocator<int>_>_>,_bssl::Span<const_std::vector<int,_std::allocator<int>_>_>,_nullptr>
            ((EqHelper *)local_1a0,"Span(vec_of_vecs)","Span(data, 2)",&local_1b0,&local_1c0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar3) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xf2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2a;
  paVar2 = (allocator<int> *)
           ((long)&gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 3);
  std::allocator<int>::allocator(paVar2);
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       ((long)&gtest_ar_2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_1e8,__l_00,paVar2);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::PushBack
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,&local_1e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1e8);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  local_214 = 3;
  local_220 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_210,"3u","vec_of_vecs.size()",&local_214,&local_220);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar3) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xf5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::pop_back
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  local_244 = 2;
  local_250 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_240,"2u","vec_of_vecs.size()",&local_244,&local_250);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar3) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xf7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::Resize
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,4);
  local_274 = 4;
  local_280 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_270,"4u","vec_of_vecs.size()",&local_274,&local_280);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar3) {
    testing::Message::Message(&local_288);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xfa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_2a0,"vec_of_vecs[0]","data[0]",pvVar5,
             (vector<int,_std::allocator<int>_> *)local_c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar3) {
    testing::Message::Message(&local_2a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xfb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,1);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_2c0,"vec_of_vecs[1]","data[1]",pvVar5,
             (vector<int,_std::allocator<int>_> *)
             &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar3) {
    testing::Message::Message(&local_2c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xfc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,2);
  local_2e1 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar3) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2e0,
               (AssertionResult *)"vec_of_vecs[2].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xfd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78,3);
  local_329 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar3) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec_of_vecs2.size_,(internal *)local_328,
               (AssertionResult *)"vec_of_vecs[3].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&vec_of_vecs2.size_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_7.message_,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  local_3dc = 4;
  local_3e8 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_7.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_3d8,"4u","vec_of_vecs2.size()",&local_3dc,&local_3e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar3) {
    testing::Message::Message(&local_3f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x102,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_7.message_,0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_408,"vec_of_vecs2[0]","data[0]",pvVar5,
             (vector<int,_std::allocator<int>_> *)local_c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar3) {
    testing::Message::Message(&local_410);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x103,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_7.message_,1);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_428,"vec_of_vecs2[1]","data[1]",pvVar5,
             (vector<int,_std::allocator<int>_> *)
             &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar3) {
    testing::Message::Message(&local_430);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x104,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_7.message_,2);
  local_449 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar3) {
    testing::Message::Message(&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_448,
               (AssertionResult *)"vec_of_vecs2[2].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x105,pcVar4);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_7.message_,3);
  local_491 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_490,&local_491,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar3) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec_of_vecs3.size_,(internal *)local_490,
               (AssertionResult *)"vec_of_vecs2[3].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x106,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&vec_of_vecs3.size_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_10.message_);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator=
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_10.message_,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  local_544 = 4;
  local_550 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_10.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_540,"4u","vec_of_vecs3.size()",&local_544,&local_550);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar3) {
    testing::Message::Message(&local_558);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x10b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_10.message_,0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_570,"vec_of_vecs3[0]","data[0]",pvVar5,
             (vector<int,_std::allocator<int>_> *)local_c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar3) {
    testing::Message::Message(&local_578);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x10c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_10.message_,1);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_590,"vec_of_vecs3[1]","data[1]",pvVar5,
             (vector<int,_std::allocator<int>_> *)
             &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar3) {
    testing::Message::Message(&local_598);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x10d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_10.message_,2);
  local_5b1 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar3) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_5b0,
               (AssertionResult *)"vec_of_vecs3[2].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x10e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_10.message_,3);
  local_5f9 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar3) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec_of_vecs4.size_,(internal *)local_5f8,
               (AssertionResult *)"vec_of_vecs3[3].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x10f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&vec_of_vecs4.size_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_13.message_,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  local_6ac = 4;
  local_6b8 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_13.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_6a8,"4u","vec_of_vecs4.size()",&local_6ac,&local_6b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar3) {
    testing::Message::Message(&local_6c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x113,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_13.message_,0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_6d8,"vec_of_vecs4[0]","data[0]",pvVar5,
             (vector<int,_std::allocator<int>_> *)local_c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar3) {
    testing::Message::Message(&local_6e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x114,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_13.message_,1);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_6f8,"vec_of_vecs4[1]","data[1]",pvVar5,
             (vector<int,_std::allocator<int>_> *)
             &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar3) {
    testing::Message::Message(&local_700);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x115,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_13.message_,2);
  local_719 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar3) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_718,
               (AssertionResult *)"vec_of_vecs4[2].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x116,pcVar4);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_13.message_,3);
  local_761 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_760,&local_761,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar3) {
    testing::Message::Message(&local_770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_16.message_,(internal *)local_760,
               (AssertionResult *)"vec_of_vecs4[3].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x117,pcVar4);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  local_7ac = 4;
  local_7b8 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_7a8,"4u","vec_of_vecs.size()",&local_7ac,&local_7b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar3) {
    testing::Message::Message(&local_7c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x11a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range2,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range2);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  __end2 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::begin
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::end
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  for (; __end2 != pvVar5; __end2 = __end2 + 1) {
    gtest_ar__8.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end2;
    local_7f9 = std::vector<int,_std::allocator<int>_>::empty(__end2);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_7f8,&local_7f9,(type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
    if (!bVar3) {
      testing::Message::Message(&local_808);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&vec_of_vecs5.size_,(internal *)local_7f8,(AssertionResult *)0x8614f6,
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_810,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x11c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_810,&local_808);
      testing::internal::AssertHelper::~AssertHelper(&local_810);
      std::__cxx11::string::~string((string *)&vec_of_vecs5.size_);
      testing::Message::~Message(&local_808);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  }
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_17.message_);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator=
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_17.message_,
             (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_13.message_);
  local_8ac = 4;
  local_8b8 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_17.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_8a8,"4u","vec_of_vecs5.size()",&local_8ac,&local_8b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar3) {
    testing::Message::Message(&local_8c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x122,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_8d8,"vec_of_vecs5[0]","data[0]",pvVar5,
             (vector<int,_std::allocator<int>_> *)local_c8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar3) {
    testing::Message::Message(&local_8e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x123,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,1);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_8f8,"vec_of_vecs5[1]","data[1]",pvVar5,
             (vector<int,_std::allocator<int>_> *)
             &data[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar3) {
    testing::Message::Message(&local_900);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x124,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_900);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,2);
  local_919 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_918,&local_919,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar3) {
    testing::Message::Message(&local_928);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_918,
               (AssertionResult *)"vec_of_vecs5[2].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x125,pcVar4);
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,3);
  local_961 = std::vector<int,_std::allocator<int>_>::empty(pvVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_960,&local_961,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar3) {
    testing::Message::Message(&local_970);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_20.message_,(internal *)local_960,
               (AssertionResult *)"vec_of_vecs5[3].empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_978,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x126,pcVar4);
    testing::internal::AssertHelper::operator=(&local_978,&local_970);
    testing::internal::AssertHelper::~AssertHelper(&local_978);
    std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  local_9ac = 4;
  local_9b8 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::size
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_13.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_9a8,"4u","vec_of_vecs4.size()",&local_9ac,&local_9b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar3) {
    testing::Message::Message(&local_9c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range2_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x129,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range2_1,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range2_1);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  __end2_1 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::begin
                       ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                        &gtest_ar_13.message_);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::end
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_13.message_);
  for (; __end2_1 != pvVar5; __end2_1 = __end2_1 + 1) {
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end2_1;
    local_9f9 = std::vector<int,_std::allocator<int>_>::empty(__end2_1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_9f8,&local_9f9,(type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
    if (!bVar3) {
      testing::Message::Message(&local_a08);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,(internal *)local_9f8,(AssertionResult *)0x8614f6,"false","true"
                 ,in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,299,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a10,&local_a08);
      testing::internal::AssertHelper::~AssertHelper(&local_a10);
      std::__cxx11::string::~string
                ((string *)
                 &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      testing::Message::~Message(&local_a08);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  }
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2a;
  paVar2 = (allocator<int> *)
           ((long)&gtest_ar__12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 3);
  std::allocator<int>::allocator(paVar2);
  __l._M_len = 1;
  __l._M_array = (iterator)
                 ((long)&gtest_ar__12.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a48,__l,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::Resize
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_17.message_,3);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a90,(vector<int,_std::allocator<int>_> *)local_a48);
  local_a78 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::TryPushBack
                        ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                         &gtest_ar_17.message_,&local_a90);
  testing::AssertionResult::AssertionResult<std::vector<int,std::allocator<int>>*>
            ((AssertionResult *)local_a70,&local_a78,(type *)0x0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a90);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar3) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_21.message_,(internal *)local_a70,
               (AssertionResult *)"vec_of_vecs5.TryPushBack(v)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x130,pcVar4);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator[]
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,3);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_ad0,"v","vec_of_vecs5[3]",
             (vector<int,_std::allocator<int>_> *)local_a48,pvVar5);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar3) {
    testing::Message::Message(&local_ad8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x131,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b10,(vector<int,_std::allocator<int>_> *)local_a48);
  pvVar5 = InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::TryPushBack
                     ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)
                      &gtest_ar_17.message_,&local_b10);
  local_af1 = pvVar5 == (vector<int,_std::allocator<int>_> *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_af0,&local_af1,(type *)0x0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b10);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar3) {
    testing::Message::Message(&local_b18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b40,(internal *)local_af0,(AssertionResult *)"vec_of_vecs5.TryPushBack(v)",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x132,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b20,&local_b18);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    std::__cxx11::string::~string((string *)&local_b40);
    testing::Message::~Message(&local_b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a48);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::~InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_17.message_);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::~InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_13.message_);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::~InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_10.message_);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::~InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)&gtest_ar_7.message_);
  local_d78 = &data[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
  do {
    local_d78 = local_d78 + -3;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d78);
  } while (local_d78 != (pointer *)local_c8);
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::~InplaceVector
            ((InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *)local_78);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}